

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-dis.c
# Opt level: O2

easm_expr * dis_parse_expr(disctx *ctx,dis_status *status,int *spos)

{
  int iVar1;
  etype eVar2;
  litem *plVar3;
  litem **pplVar4;
  easm_sinsn *sinsn;
  easm_expr *peVar5;
  
  iVar1 = *spos;
  if (iVar1 < ctx->atomsnum) {
    plVar3 = ctx->atoms[iVar1];
    eVar2 = plVar3->type;
    *spos = iVar1 + 1;
    if (eVar2 == LITEM_EXPR) {
      return plVar3->expr;
    }
    if (plVar3->type == LITEM_SESTART) {
      sinsn = dis_parse_sinsn(ctx,status,spos);
      peVar5 = easm_expr_sinsn(sinsn);
      pplVar4 = ctx->atoms;
      iVar1 = *spos;
      *spos = iVar1 + 1;
      if (pplVar4[iVar1]->type == LITEM_SEEND) {
        return peVar5;
      }
    }
  }
  abort();
}

Assistant:

static struct easm_expr *dis_parse_expr(struct disctx *ctx, enum dis_status *status, int *spos) {
	if (*spos >= ctx->atomsnum)
		abort();
	if (ctx->atoms[*spos]->type == LITEM_EXPR)
		return ctx->atoms[(*spos)++]->expr;
	if (ctx->atoms[(*spos)++]->type != LITEM_SESTART)
		abort();
	struct easm_expr *res = easm_expr_sinsn(dis_parse_sinsn(ctx, status, spos));
	if (ctx->atoms[(*spos)++]->type != LITEM_SEEND)
		abort();
	return res;
}